

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::scanInput(Parser *this,ScannedTopLevelItem *item)

{
  bool bVar1;
  Module *pMVar2;
  InputDeclaration *o;
  string *name;
  size_type sVar3;
  Identifier *args;
  CodeLocation *args_00;
  pool_ref<soul::heart::InputDeclaration> local_90;
  CompileMessage local_88;
  undefined1 local_40 [8];
  CodeLocation errorLocation;
  InputDeclaration *inputDeclaration;
  Ptr local_18;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  local_18.object = (SourceCodeText *)item;
  item_local = (ScannedTopLevelItem *)this;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  getCurrentTokeniserPosition
            ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              *)&inputDeclaration);
  std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::push_back
            (&item->inputDecls,(value_type *)&inputDeclaration);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  args_00 = &(this->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).location;
  o = Module::allocate<soul::heart::InputDeclaration,soul::CodeLocation&>(pMVar2,args_00);
  errorLocation.location.data = (char *)parseGeneralIdentifier(this);
  (o->super_IODeclaration).name.name = (string *)errorLocation.location.data;
  CodeLocation::CodeLocation((CodeLocation *)local_40,args_00);
  name = Identifier::operator_cast_to_string_(&(o->super_IODeclaration).name);
  bVar1 = isReservedFunctionName(name);
  if (!bVar1) {
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    sVar3 = std::
            vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
            ::size(&pMVar2->inputs);
    (o->super_IODeclaration).index = (uint32_t)sVar3;
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    pool_ref<soul::heart::InputDeclaration>::pool_ref<soul::heart::InputDeclaration,void>
              (&local_90,o);
    std::
    vector<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
    ::push_back(&pMVar2->inputs,&local_90);
    pool_ref<soul::heart::InputDeclaration>::~pool_ref(&local_90);
    skipPastNextOccurrenceOf(this,(TokenType)0x54c9e0);
    CodeLocation::~CodeLocation((CodeLocation *)local_40);
    return;
  }
  Errors::invalidEndpointName<soul::Identifier&>
            (&local_88,(Errors *)&(o->super_IODeclaration).name,args);
  CodeLocation::throwError((CodeLocation *)local_40,&local_88);
}

Assistant:

void scanInput (ScannedTopLevelItem& item)
    {
        item.inputDecls.push_back (getCurrentTokeniserPosition());
        auto& inputDeclaration = module->allocate<heart::InputDeclaration> (location);
        inputDeclaration.name = parseGeneralIdentifier();

        auto errorLocation = location;
        if (isReservedFunctionName (inputDeclaration.name))
            errorLocation.throwError (Errors::invalidEndpointName (inputDeclaration.name));

        inputDeclaration.index = (uint32_t) module->inputs.size();

        module->inputs.push_back (inputDeclaration);
        skipPastNextOccurrenceOf (HEARTOperator::semicolon);
    }